

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChildFrame(ImGuiID id,ImVec2 *size,ImGuiWindowFlags extra_flags)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  ImGuiStyleVar unaff_retaddr;
  bool ret;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImGuiID in_stack_ffffffffffffffd4;
  int count;
  ImGuiContext *pIVar2;
  int count_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  
  pIVar2 = GImGui;
  PushStyleColor((ImGuiCol)((ulong)in_RSI >> 0x20),
                 (ImVec4 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  count_00 = (int)((ulong)pIVar2 >> 0x20);
  PushStyleVar((ImGuiStyleVar)((ulong)in_RSI >> 0x20),(float)in_RSI);
  PushStyleVar((ImGuiStyleVar)((ulong)in_RSI >> 0x20),(float)in_RSI);
  PushStyleVar(unaff_retaddr,(ImVec2 *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  bVar1 = BeginChild(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,false,0x12cb3f);
  count = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
  PopStyleVar(count_00);
  PopStyleColor(count);
  return (bool)((byte)((uint)count >> 0x18) & 1);
}

Assistant:

bool ImGui::BeginChildFrame(ImGuiID id, const ImVec2& size, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    PushStyleColor(ImGuiCol_ChildBg, style.Colors[ImGuiCol_FrameBg]);
    PushStyleVar(ImGuiStyleVar_ChildRounding, style.FrameRounding);
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, style.FrameBorderSize);
    PushStyleVar(ImGuiStyleVar_WindowPadding, style.FramePadding);
    bool ret = BeginChild(id, size, true, ImGuiWindowFlags_NoMove | ImGuiWindowFlags_AlwaysUseWindowPadding | extra_flags);
    PopStyleVar(3);
    PopStyleColor();
    return ret;
}